

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiQuaternion __thiscall Assimp::B3DImporter::ReadQuat(B3DImporter *this)

{
  float fVar1;
  float px;
  float py;
  float pz;
  float z;
  float y;
  float x;
  float w;
  B3DImporter *this_local;
  
  fVar1 = ReadFloat(this);
  px = ReadFloat(this);
  py = ReadFloat(this);
  pz = ReadFloat(this);
  aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&this_local,-fVar1,px,py,pz);
  return _this_local;
}

Assistant:

aiQuaternion B3DImporter::ReadQuat(){
    // (aramis_acg) Fix to adapt the loader to changed quat orientation
    float w=-ReadFloat();
    float x=ReadFloat();
    float y=ReadFloat();
    float z=ReadFloat();
    return aiQuaternion( w,x,y,z );
}